

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphps(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  int extend;
  long gcount;
  long pcount;
  int simple;
  int *status_local;
  long *naxes_local;
  int naxis_local;
  int bitpix_local;
  fitsfile *fptr_local;
  
  ffphpr(fptr,1,bitpix,naxis,naxes,0,1,1,status);
  return *status;
}

Assistant:

int ffphps( fitsfile *fptr, /* I - FITS file pointer                        */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            long naxes[],   /* I - length of each data axis                 */
            int *status)    /* IO - error status                            */
/*
  write STANDARD set of required primary header keywords
*/
{
    int simple = 1;     /* does file conform to FITS standard? 1/0  */
    long pcount = 0;    /* number of group parameters (usually 0)   */
    long gcount = 1;    /* number of random groups (usually 1 or 0) */
    int extend = 1;     /* may FITS file have extensions?           */

    ffphpr(fptr, simple, bitpix, naxis, naxes, pcount, gcount, extend, status);
    return(*status);
}